

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

void __thiscall
wasm::InsertOrderedSet<wasm::GlobalGet_*>::erase
          (InsertOrderedSet<wasm::GlobalGet_*> *this,GlobalGet **val)

{
  iterator __it;
  
  __it = std::
         _Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find((_Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this,val);
  if (__it.
      super__Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::list<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::erase
              (&this->List,
               *(_List_node_base **)
                ((long)__it.
                       super__Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
                       ._M_cur + 0x10));
    std::
    _Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this,(const_iterator)
                    __it.
                    super__Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
                    ._M_cur);
    return;
  }
  return;
}

Assistant:

void erase(const T& val) {
    auto it = Map.find(val);
    if (it != Map.end()) {
      List.erase(it->second);
      Map.erase(it);
    }
  }